

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlabad.c
# Opt level: O1

int dlabad_slu(double *small,double *large)

{
  double dVar1;
  
  dVar1 = log10(*large);
  if (2000.0 < dVar1) {
    dVar1 = *small;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    *small = dVar1;
    dVar1 = *large;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    *large = dVar1;
  }
  return 0;
}

Assistant:

int dlabad_slu(double *small, double *large)
{
/*  -- LAPACK auxiliary routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       October 31, 1992   


    Purpose   
    =======   

    DLABAD takes as input the values computed by SLAMCH for underflow and 
  
    overflow, and returns the square root of each of these values if the 
  
    log of LARGE is sufficiently large.  This subroutine is intended to   
    identify machines with a large exponent range, such as the Crays, and 
  
    redefine the underflow and overflow limits to be the square roots of 
  
    the values computed by DLAMCH.  This subroutine is needed because   
    DLAMCH does not compensate for poor arithmetic in the upper half of   
    the exponent range, as is found on a Cray.   

    Arguments   
    =========   

    SMALL   (input/output) DOUBLE PRECISION   
            On entry, the underflow threshold as computed by DLAMCH.   
            On exit, if LOG10(LARGE) is sufficiently large, the square   
            root of SMALL, otherwise unchanged.   

    LARGE   (input/output) DOUBLE PRECISION   
            On entry, the overflow threshold as computed by DLAMCH.   
            On exit, if LOG10(LARGE) is sufficiently large, the square   
            root of LARGE, otherwise unchanged.   

    ===================================================================== 
  


       If it looks like we're on a Cray, take the square root of   
       SMALL and LARGE to avoid overflow and underflow problems. */

    if (log10(*large) > 2e3) {
	*small = sqrt(*small);
	*large = sqrt(*large);
    }

    return 0;

/*     End of DLABAD */

}